

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astar.hpp
# Opt level: O2

void __thiscall astar::AStar::MigratePoint(AStar *this,PointCost *pc,Point *start,Point *end)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  iterator iVar5;
  long lVar6;
  int (*paiVar7) [2];
  Point tmp;
  int cost;
  undefined1 local_78 [16];
  element_type *local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_58;
  priority_queue<astar::AStar::PointCost,_std::vector<astar::AStar::PointCost,_std::allocator<astar::AStar::PointCost>_>,_std::less<astar::AStar::PointCost>_>
  local_50;
  
  local_58 = &(this->closeZone)._M_h;
  local_68 = (element_type *)&this->openZone;
  paiVar7 = MigratePoint::move;
  local_60._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)end;
  for (lVar6 = 0; lVar6 < (int)this->moveType; lVar6 = lVar6 + 1) {
    local_78._0_8_ = *paiVar7;
    tmp = operator+(&pc->point,(Point *)local_78);
    bVar2 = PointVaild(this,&tmp);
    if (bVar2) {
      local_78._0_4_ = (this->map).m * tmp.y + tmp.x;
      iVar5 = std::
              _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(local_58,(key_type *)local_78);
      if (iVar5.super__Node_iterator_base<std::pair<const_unsigned_int,_int>,_false>._M_cur ==
          (__node_type *)0x0) {
        std::vector<astar::AStar::PointCost,_std::allocator<astar::AStar::PointCost>_>::vector
                  (&local_50.c,
                   (vector<astar::AStar::PointCost,_std::allocator<astar::AStar::PointCost>_> *)
                   local_68);
        bVar2 = InOpenZone(this,&local_50,&tmp);
        std::vector<astar::AStar::PointCost,_std::allocator<astar::AStar::PointCost>_>::~vector
                  (&local_50.c);
        if (!bVar2) {
          iVar1 = pc->cost;
          iVar3 = MoveCast(this,&pc->point,&tmp,1,1,1);
          iVar4 = MoveCast(this,&tmp,(Point *)local_60._M_pi,1,1,1);
          cost = iVar4 + iVar3 + iVar1;
          std::make_shared<astar::AStar::PointCost,astar::AStar::PointCost_const&>
                    ((PointCost *)local_78);
          std::
          priority_queue<astar::AStar::PointCost,std::vector<astar::AStar::PointCost,std::allocator<astar::AStar::PointCost>>,std::less<astar::AStar::PointCost>>
          ::emplace<astar::Point&,int&,std::shared_ptr<astar::AStar::PointCost>>
                    ((priority_queue<astar::AStar::PointCost,std::vector<astar::AStar::PointCost,std::allocator<astar::AStar::PointCost>>,std::less<astar::AStar::PointCost>>
                      *)local_68,&tmp,&cost,(shared_ptr<astar::AStar::PointCost> *)local_78);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_78 + 8));
        }
      }
    }
    paiVar7 = (int (*) [2])&((Point *)paiVar7)[1].x;
  }
  return;
}

Assistant:

void MigratePoint(const PointCost& pc, const Point& start, const Point& end)
    {
        // up, down, left, right, diagonal up right, diagonal down right, diagonal down left, diagonal up left
        static int move[8][2] = {{0, -1}, {0, 1}, {-1, 0}, {1, 0}, {1, -1}, {1, 1}, {-1, 1}, {-1, -1}};
        for (int i = 0; i < moveType; i++) {
            auto tmp = pc.point + Point(move[i][0], move[i][1]);
            if (PointVaild(tmp)) {
                if (closeZone.find(tmp.x + tmp.y * map.Width()) != closeZone.end()) {
                    continue;
                }
                if (!InOpenZone(openZone, tmp)) {
                    int cost = pc.cost + MoveCast(pc.point, tmp) + MoveCast(tmp, end);
                    openZone.emplace(tmp, cost, std::make_shared<PointCost>(pc));
                }
            }
        }
    }